

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O1

string * __thiscall
duckdb::Linenoise::AddContinuationMarkers_abi_cxx11_
          (string *__return_storage_ptr__,Linenoise *this,char *buf,size_t len,int plen,
          int cursor_row,vector<duckdb::highlightToken,_true> *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined7 uVar2;
  bool bVar3;
  undefined8 *puVar4;
  size_t sVar5;
  long lVar6;
  reference pvVar7;
  tokenType tVar8;
  int iVar9;
  long lVar10;
  pointer phVar11;
  ulong uVar12;
  char *__s;
  size_type __n;
  vector<duckdb::highlightToken,_true> new_tokens;
  int rows;
  highlightToken token;
  int cols;
  size_t local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  int local_ac;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> local_a8;
  long local_88;
  int local_80;
  int local_7c;
  char *local_78;
  highlightToken local_70;
  int local_58;
  int local_54;
  Linenoise *local_50;
  size_t local_48;
  long local_40;
  size_t local_38;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_7c = 1;
  local_c0 = 0;
  local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ac = plen;
  local_80 = cursor_row;
  local_54 = plen;
  local_50 = this;
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
            (&local_a8,
             ((long)(tokens->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(tokens->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_b8 = paVar1;
  if (local_c0 < len) {
    local_40 = (long)local_ac;
    uVar12 = 0;
    lVar10 = 0;
    __n = 0;
    local_48 = len;
    do {
      local_88 = lVar10;
      bVar3 = IsNewline(buf[local_c0]);
      NextPosition(local_50,buf,local_48,&local_c0,&local_7c,&local_54,local_ac);
      for (; uVar12 < local_c0; uVar12 = uVar12 + 1) {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      lVar10 = local_88;
      if (bVar3) {
        local_58 = local_7c;
        puVar4 = &continuationPrompt;
        if (local_7c == local_80) {
          puVar4 = &continuationSelectedPrompt;
        }
        __s = anon_var_dwarf_647c332 + 9;
        if (local_50->continuation_markers != false) {
          __s = (char *)*puVar4;
        }
        local_38 = strlen(__s);
        local_78 = __s;
        sVar5 = ComputeRenderWidth(__s,local_38);
        iVar9 = local_ac - (int)sVar5;
        if (iVar9 != 0 && (int)sVar5 <= local_ac) {
          do {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        lVar10 = local_88;
        local_78 = (char *)((local_40 - sVar5) + local_38);
        if (__n < (ulong)(((long)(tokens->
                                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ).
                                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(tokens->
                                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ).
                                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555)) {
          lVar6 = (long)(tokens->
                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ).
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(tokens->
                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ).
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          while ((__n < (ulong)((lVar6 >> 3) * -0x5555555555555555) &&
                 (pvVar7 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n),
                 pvVar7->start < local_c0))) {
            pvVar7 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
            pvVar7->start = pvVar7->start + lVar10;
            pvVar7 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
            if (local_a8.
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_a8.
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
              _M_realloc_insert<duckdb::highlightToken_const&>
                        ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                         &local_a8,
                         (iterator)
                         local_a8.
                         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pvVar7);
            }
            else {
              uVar2 = *(undefined7 *)&pvVar7->field_0x11;
              (local_a8.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish)->search_match = pvVar7->search_match;
              *(undefined7 *)
               &(local_a8.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar2;
              uVar2 = *(undefined7 *)&pvVar7->field_0x1;
              sVar5 = pvVar7->start;
              (local_a8.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish)->type = pvVar7->type;
              *(undefined7 *)
               &(local_a8.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 = uVar2;
              (local_a8.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish)->start = sVar5;
              local_a8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_a8.
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar6 = (long)(tokens->
                          super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                          ).
                          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(tokens->
                          super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                          ).
                          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            __n = __n + 1;
          }
          if ((__n == 0) ||
             (((long)(tokens->
                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(tokens->
                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 1U <=
              __n)) {
            tVar8 = TOKEN_IDENTIFIER;
          }
          else {
            pvVar7 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n - 1);
            tVar8 = pvVar7->type;
          }
          local_70.search_match = false;
          local_70.start = local_c0 + local_88;
          local_70.type = local_58 == local_80 | TOKEN_CONTINUATION;
          if (local_a8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_a8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
            _M_realloc_insert<duckdb::highlightToken_const&>
                      ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                       &local_a8,
                       (iterator)
                       local_a8.
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            *(ulong *)&(local_a8.
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->search_match =
                 (ulong)(uint7)local_70._17_7_ << 8;
            *(ulong *)local_a8.
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                 CONCAT71(local_70._1_7_,local_58 == local_80) | 6;
            (local_a8.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start = local_70.start;
            local_a8.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_a8.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_70.start = local_88 + (long)local_78 + local_c0;
          local_70.search_match = false;
          local_70.type = tVar8;
          if (local_a8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_a8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
            _M_realloc_insert<duckdb::highlightToken_const&>
                      ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                       &local_a8,
                       (iterator)
                       local_a8.
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            *(ulong *)&(local_a8.
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->search_match =
                 (ulong)(uint7)local_70._17_7_ << 8;
            *(ulong *)local_a8.
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish = CONCAT71(local_70._1_7_,tVar8);
            (local_a8.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start = local_70.start;
            local_a8.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_a8.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        lVar10 = local_88 + (long)local_78;
      }
    } while (local_c0 < local_48);
  }
  else {
    __n = 0;
    lVar10 = 0;
    uVar12 = 0;
  }
  for (; uVar12 < local_c0; uVar12 = uVar12 + 1) {
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  phVar11 = (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (__n < (ulong)(((long)(tokens->
                           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ).
                           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)phVar11 >> 3) *
                   -0x5555555555555555)) {
    do {
      pvVar7 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
      pvVar7->start = pvVar7->start + lVar10;
      pvVar7 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
      if (local_a8.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_a8.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
        _M_realloc_insert<duckdb::highlightToken_const&>
                  ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                   &local_a8,
                   (iterator)
                   local_a8.
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish,pvVar7);
      }
      else {
        uVar2 = *(undefined7 *)&pvVar7->field_0x11;
        (local_a8.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->search_match = pvVar7->search_match;
        *(undefined7 *)
         &(local_a8.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar2;
        uVar2 = *(undefined7 *)&pvVar7->field_0x1;
        sVar5 = pvVar7->start;
        (local_a8.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->type = pvVar7->type;
        *(undefined7 *)
         &(local_a8.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_0x1 = uVar2;
        (local_a8.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->start = sVar5;
        local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_a8.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      __n = __n + 1;
      phVar11 = (tokens->
                super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (__n < (ulong)(((long)(tokens->
                                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ).
                                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)phVar11 >> 3) *
                          -0x5555555555555555));
  }
  (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (phVar11 != (pointer)0x0) {
    operator_delete(phVar11);
  }
  if (local_a8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

string Linenoise::AddContinuationMarkers(const char *buf, size_t len, int plen, int cursor_row,
                                         vector<highlightToken> &tokens) const {
	std::string result;
	int rows = 1;
	int cols = plen;
	size_t cpos = 0;
	size_t prev_pos = 0;
	size_t extra_bytes = 0;    // extra bytes introduced
	size_t token_position = 0; // token position
	vector<highlightToken> new_tokens;
	new_tokens.reserve(tokens.size());
	while (cpos < len) {
		bool is_newline = IsNewline(buf[cpos]);
		NextPosition(buf, len, cpos, rows, cols, plen);
		for (; prev_pos < cpos; prev_pos++) {
			result += buf[prev_pos];
		}
		if (is_newline) {
			bool is_cursor_row = rows == cursor_row;
			const char *prompt = is_cursor_row ? continuationSelectedPrompt : continuationPrompt;
			if (!continuation_markers) {
				prompt = "";
			}
			size_t continuationLen = strlen(prompt);
			size_t continuationRender = ComputeRenderWidth(prompt, continuationLen);
			// pad with spaces prior to prompt
			for (int i = int(continuationRender); i < plen; i++) {
				result += " ";
			}
			result += prompt;
			size_t continuationBytes = plen - continuationRender + continuationLen;
			if (token_position < tokens.size()) {
				for (; token_position < tokens.size(); token_position++) {
					if (tokens[token_position].start >= cpos) {
						// not there yet
						break;
					}
					tokens[token_position].start += extra_bytes;
					new_tokens.push_back(tokens[token_position]);
				}
				tokenType prev_type = tokenType::TOKEN_IDENTIFIER;
				if (token_position > 0 && token_position < tokens.size() + 1) {
					prev_type = tokens[token_position - 1].type;
				}
				highlightToken token;
				token.start = cpos + extra_bytes;
				token.type = is_cursor_row ? tokenType::TOKEN_CONTINUATION_SELECTED : tokenType::TOKEN_CONTINUATION;
				token.search_match = false;
				new_tokens.push_back(token);

				token.start = cpos + extra_bytes + continuationBytes;
				token.type = prev_type;
				token.search_match = false;
				new_tokens.push_back(token);
			}
			extra_bytes += continuationBytes;
		}
	}
	for (; prev_pos < cpos; prev_pos++) {
		result += buf[prev_pos];
	}
	for (; token_position < tokens.size(); token_position++) {
		tokens[token_position].start += extra_bytes;
		new_tokens.push_back(tokens[token_position]);
	}
	tokens = std::move(new_tokens);
	return result;
}